

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

Matrix * __thiscall Matrix::differentiate(Matrix *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  double dVar7;
  double next;
  double dStack_38;
  int i_2;
  double last;
  int i_1;
  int offset;
  int dim;
  int i;
  int *indices;
  bool done;
  int n;
  Matrix *this_local;
  
  iVar1 = this->nMatrixDimension;
  iVar4 = iVar1 + -1;
  bVar3 = false;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar4;
  uVar5 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar5);
  for (offset = 0; offset < iVar4; offset = offset + 1) {
    *(undefined4 *)((long)pvVar6 + (long)offset * 4) = 0;
  }
  while (!bVar3) {
    if (iVar4 == 0) {
      bVar3 = true;
    }
    else {
      for (i_1 = iVar1 + -2;
          (i_1 != -1 &&
          (*(int *)((long)pvVar6 + (long)i_1 * 4) = *(int *)((long)pvVar6 + (long)i_1 * 4) + 1,
          *(int *)((long)pvVar6 + (long)i_1 * 4) == this->pSize[i_1])); i_1 = i_1 + -1) {
        *(undefined4 *)((long)pvVar6 + (long)i_1 * 4) = 0;
        if (i_1 == 0) {
          bVar3 = true;
        }
      }
    }
    last._4_4_ = 0;
    for (last._0_4_ = 0; last._0_4_ < iVar4; last._0_4_ = last._0_4_ + 1) {
      last._4_4_ = *(int *)((long)pvVar6 + (long)last._0_4_ * 4) * this->pMult[last._0_4_] +
                   last._4_4_;
    }
    dStack_38 = this->pData[last._4_4_];
    for (next._4_4_ = 1; next._4_4_ < this->pSize[iVar4]; next._4_4_ = next._4_4_ + 1) {
      dVar7 = this->pData[last._4_4_ + next._4_4_] - dStack_38;
      dStack_38 = this->pData[last._4_4_ + next._4_4_];
      this->pData[last._4_4_ + next._4_4_] = dVar7;
    }
  }
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  return this;
}

Assistant:

Matrix &Matrix::differentiate()
{
	int n = nMatrixDimension-1;
	bool done = false;
	int *indices = new int[n];
	for (int i=0; i<n; ++i)
		indices[i] = 0;
	
	while (!done) {
		
		// increase indices
		if (!n)
			done = true;
		else for (int dim=n-1; dim+1; --dim) {
			indices[dim]++;
			if (indices[dim] == pSize[dim]) {
				indices[dim] = 0;
				if (!dim) 
					done = true;
			} else
				break;
		}
		
		// create offset from indices
		int offset = 0;
		for (int i=0; i<n; ++i)
			offset += indices[i]*pMult[i];
		
		// differentiate last dimension of this offset
		double last = pData[offset];
		for (int i=1; i<pSize[n]; ++i) {
			double next = pData[offset+i] - last;
			last = pData[offset+i];
			pData[offset+i] = next;
		}
	}
	
	delete[] indices;
	return *this;
}